

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void ly_log_dbg(LY_LOG_DBG_GROUP group,char *format,...)

{
  char in_AL;
  int iVar1;
  LY_ERR *pLVar2;
  uint8_t *puVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined1 local_48 [8];
  va_list ap;
  char *local_28;
  char *str_group;
  char *dbg_format;
  char *format_local;
  LY_LOG_DBG_GROUP group_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  if ((ly_log_dbg_groups & group) != 0) {
    local_e8 = in_RDX;
    local_e0 = in_RCX;
    local_d8 = in_R8;
    local_d0 = in_R9;
    dbg_format = format;
    format_local._4_4_ = group;
    switch(group) {
    case LY_LDGDICT:
      local_28 = "DICT";
      break;
    case LY_LDGYANG:
      local_28 = "YANG";
      break;
    default:
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/log.c",
             0xba);
      return;
    case LY_LDGYIN:
      local_28 = "YIN";
      break;
    case LY_LDGXPATH:
      local_28 = "XPATH";
      break;
    case LY_LDGDIFF:
      local_28 = "DIFF";
    }
    iVar1 = asprintf(&str_group,"%s: %s",local_28,format);
    if (iVar1 == -1) {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","ly_log_dbg");
    }
    else {
      ap[0].overflow_arg_area = local_f8;
      ap[0]._0_8_ = &stack0x00000008;
      local_48._4_4_ = 0x30;
      local_48._0_4_ = 0x10;
      puVar3 = ly_vlog_hide_location();
      log_vprintf(LY_LLDBG,*puVar3,str_group,(char *)0x0,(__va_list_tag *)local_48);
    }
  }
  return;
}

Assistant:

void
ly_log_dbg(LY_LOG_DBG_GROUP group, const char *format, ...)
{
    char *dbg_format;
    const char *str_group;
    va_list ap;

    if (!(ly_log_dbg_groups & group)) {
        return;
    }

    switch (group) {
    case LY_LDGDICT:
        str_group = "DICT";
        break;
    case LY_LDGYANG:
        str_group = "YANG";
        break;
    case LY_LDGYIN:
        str_group = "YIN";
        break;
    case LY_LDGXPATH:
        str_group = "XPATH";
        break;
    case LY_LDGDIFF:
        str_group = "DIFF";
        break;
    default:
        LOGINT;
        return;
    }

    if (asprintf(&dbg_format, "%s: %s", str_group, format) == -1) {
        LOGMEM;
        return;
    }

    va_start(ap, format);
    log_vprintf(LY_LLDBG, (*ly_vlog_hide_location()), dbg_format, NULL, ap);
    va_end(ap);
}